

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O2

void __thiscall
FastPForLib::VariableByte::encodeToByteArray<unsigned_long>
          (VariableByte *this,unsigned_long *in,size_t length,uint8_t *bout,size_t *nvalue)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  size_t k;
  size_t sVar4;
  byte *pbVar5;
  uint uVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar10[8] = 0x7f;
  auVar10._0_8_ = 0x7f7f7f7f7f7f7f7f;
  auVar10[9] = 0x7f;
  auVar10[10] = 0x7f;
  auVar10[0xb] = 0x7f;
  auVar10[0xc] = 0x7f;
  auVar10[0xd] = 0x7f;
  auVar10[0xe] = 0x7f;
  auVar10[0xf] = 0x7f;
  auVar3 = vpmovsxbq_avx2(ZEXT416(0x312a231c));
  auVar11[8] = 0x80;
  auVar11._0_8_ = 0x8080808080808080;
  auVar11[9] = 0x80;
  auVar11[10] = 0x80;
  auVar11[0xb] = 0x80;
  auVar11[0xc] = 0x80;
  auVar11[0xd] = 0x80;
  auVar11[0xe] = 0x80;
  auVar11[0xf] = 0x80;
  pbVar5 = bout;
  for (sVar4 = 0; length != sVar4; sVar4 = sVar4 + 1) {
    uVar1 = in[sVar4];
    bVar7 = (byte)uVar1;
    if (uVar1 < 0x80) {
      *pbVar5 = bVar7 | 0x80;
      pbVar5 = pbVar5 + 1;
    }
    else {
      uVar6 = (uint)uVar1;
      if (uVar1 < 0x4000) {
        *pbVar5 = bVar7 & 0x7f;
        pbVar5[1] = (byte)(uVar6 >> 7) | 0x80;
        pbVar5 = pbVar5 + 2;
      }
      else if (uVar1 < 0x200000) {
        *pbVar5 = bVar7 & 0x7f;
        pbVar5[1] = (byte)(uVar1 >> 7) & 0x7f;
        pbVar5[2] = (byte)(uVar6 >> 0xe) | 0x80;
        pbVar5 = pbVar5 + 3;
      }
      else if (uVar1 < 0x10000000) {
        *pbVar5 = bVar7 & 0x7f;
        pbVar5[1] = (byte)(uVar1 >> 7) & 0x7f;
        pbVar5[2] = (byte)(uVar1 >> 0xe) & 0x7f;
        pbVar5[3] = (byte)(uVar6 >> 0x15) | 0x80;
        pbVar5 = pbVar5 + 4;
      }
      else if (uVar1 >> 0x23 == 0) {
        auVar2 = vpinsrb_avx(ZEXT416(uVar6),(uint)(uVar1 >> 7) & 0x1ffffff,1);
        auVar2 = vpinsrb_avx(auVar2,(uint)(uVar1 >> 0xe) & 0x3ffff,2);
        auVar2 = vpinsrb_avx(auVar2,(uint)(uVar1 >> 0x15) & 0x7ff,3);
        auVar2 = vpand_avx(auVar2,auVar10);
        *(int *)pbVar5 = auVar2._0_4_;
        pbVar5[4] = (byte)(uVar1 >> 0x1c) | 0x80;
        pbVar5 = pbVar5 + 5;
      }
      else {
        bVar7 = (byte)(uVar1 >> 0x23);
        if (uVar1 >> 0x2a == 0) {
          auVar2 = vpinsrb_avx(ZEXT416(uVar6),(uint)(uVar1 >> 7) & 0x1ffffff,1);
          auVar2 = vpinsrb_avx(auVar2,(uint)(uVar1 >> 0xe) & 0x3ffff,2);
          auVar2 = vpinsrb_avx(auVar2,(uint)(uVar1 >> 0x15) & 0x7ff,3);
          auVar2 = vpand_avx(auVar2,auVar10);
          *(int *)pbVar5 = auVar2._0_4_;
          pbVar5[4] = (byte)(uVar1 >> 0x1c) & 0x7f;
          pbVar5[5] = bVar7 | 0x80;
          pbVar5 = pbVar5 + 6;
        }
        else if (uVar1 >> 0x31 == 0) {
          auVar2 = vpinsrb_avx(ZEXT416(uVar6),(uint)(uVar1 >> 7) & 0x1ffffff,1);
          auVar2 = vpinsrb_avx(auVar2,(uint)(uVar1 >> 0xe) & 0x3ffff,2);
          auVar2 = vpinsrb_avx(auVar2,(uint)(uVar1 >> 0x15) & 0x7ff,3);
          auVar2 = vpand_avx(auVar2,auVar10);
          *(int *)pbVar5 = auVar2._0_4_;
          pbVar5[4] = (byte)(uVar1 >> 0x1c) & 0x7f;
          pbVar5[5] = bVar7 & 0x7f;
          pbVar5[6] = (byte)(uVar1 >> 0x2a) | 0x80;
          pbVar5 = pbVar5 + 7;
        }
        else {
          auVar9 = vpbroadcastq_avx512vl();
          if (uVar1 >> 0x38 == 0) {
            auVar9 = vpsrlvq_avx2(auVar9,auVar3);
            auVar2 = vpinsrb_avx(ZEXT416(uVar6),(uint)(uVar1 >> 7) & 0x1ffffff,1);
            auVar8 = vpmovqb_avx512vl(auVar9);
            auVar2 = vpinsrb_avx(auVar2,(uint)(uVar1 >> 0xe) & 0x3ffff,2);
            auVar2 = vpinsrb_avx(auVar2,uVar6 >> 0x15,3);
            auVar2 = vpunpckldq_avx(auVar2,ZEXT416(auVar8._0_4_));
            vpand_avx(auVar2,auVar10);
            auVar2 = vpor_avx(auVar2,auVar11);
            vmread((uint)(uVar1 >> 0x31));
            *(long *)pbVar5 = auVar2._0_8_;
            pbVar5 = pbVar5 + 8;
          }
          else {
            auVar9 = vpsrlvq_avx2(auVar9,auVar3);
            auVar2 = vpinsrb_avx(ZEXT416(uVar6),(uint)(uVar1 >> 7) & 0x1ffffff,1);
            auVar8 = vpmovqb_avx512vl(auVar9);
            auVar2 = vpinsrb_avx(auVar2,(uint)(uVar1 >> 0xe) & 0x3ffff,2);
            auVar2 = vpinsrb_avx(auVar2,(uint)(uVar1 >> 0x15) & 0x7ff,3);
            auVar2 = vpunpckldq_avx(auVar2,ZEXT416(auVar8._0_4_));
            auVar2 = vpand_avx(auVar2,auVar10);
            *(long *)pbVar5 = auVar2._0_8_;
            bVar7 = (byte)(uVar1 >> 0x38);
            if ((long)uVar1 < 0) {
              pbVar5[8] = bVar7 & 0x7f;
              pbVar5[9] = 0x81;
              pbVar5 = pbVar5 + 10;
            }
            else {
              pbVar5[8] = bVar7 | 0x80;
              pbVar5 = pbVar5 + 9;
            }
          }
        }
      }
    }
  }
  *nvalue = (long)pbVar5 - (long)bout;
  return;
}

Assistant:

void encodeToByteArray(const T *in, const size_t length, uint8_t *bout,
                         size_t &nvalue) {
    const uint8_t *const initbout = bout;
    for (size_t k = 0; k < length; ++k) {
      const uint64_t val = in[k];
      /**
       * Code below could be shorter. Whether it could be faster
       * depends on your compiler and machine.
       */
      if (val < (1ULL << 7)) {
        *bout = static_cast<uint8_t>(val | 0x80);
        ++bout;
      } else if (val < (1ULL << 14)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bitsmaskless<1>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 21)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bitsmaskless<2>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 28)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bitsmaskless<3>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 35)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bitsmaskless<4>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 42)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bitsmaskless<5>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 49)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bitsmaskless<6>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 56)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bits<6>(val);
        ++bout;
        *bout = extract7bitsmaskless<7>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 63)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bits<6>(val);
        ++bout;
        *bout = extract7bits<7>(val);
        ++bout;
        *bout = extract7bitsmaskless<8>(val) | 0x80;
        ++bout;
      } else {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bits<6>(val);
        ++bout;
        *bout = extract7bits<7>(val);
        ++bout;
        *bout = extract7bits<8>(val);
        ++bout;
        *bout = extract7bitsmaskless<9>(val) | 0x80;
        ++bout;
      }
    }
    nvalue = bout - initbout;
  }